

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseRefType(WastParser *this,Type *out_type)

{
  TokenType TVar1;
  Result RVar2;
  char **ppcVar3;
  long lVar4;
  Type type;
  Token token;
  Type local_b0;
  undefined1 local_a8 [32];
  char **local_88;
  undefined1 local_80 [8];
  char *local_78 [2];
  string local_68;
  size_t local_48;
  char *pcStack_40;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_38;
  undefined8 uStack_30;
  
  TVar1 = Peek(this,0);
  if (TVar1 == First_Type) {
    Consume((Token *)local_a8,this);
    if (((TokenType)local_88 & ~AssertExhaustion) != First_Type) {
      __assert_fail("HasType()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/token.h"
                    ,0x68,"Type wabt::Token::type() const");
    }
    local_b0.enum_ = local_80._0_4_;
    local_b0.type_index_ = local_80._4_4_;
    if ((local_80._0_4_ == ExternRef) && (this->options_[10] == (WastParseOptions)0x0)) {
      local_38.offset = local_a8._16_8_;
      uStack_30 = local_a8._24_8_;
      local_48 = local_a8._0_8_;
      pcStack_40 = (char *)local_a8._8_8_;
      Type::GetName_abi_cxx11_(&local_68,&local_b0);
      Error(this,0x1dfce1,local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      RVar2.enum_ = Error;
    }
    else {
      out_type->enum_ = local_80._0_4_;
      out_type->type_index_ = local_80._4_4_;
      RVar2.enum_ = Ok;
    }
  }
  else {
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"funcref","");
    ppcVar3 = &(((anon_union_24_4_98baf137_for_Token_2 *)local_80)->text_)._M_str;
    local_88 = ppcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"externref","");
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68._M_string_length = 0;
    local_68.field_2._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
               (string *)local_a8,&local_68);
    RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_68,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_68);
    lVar4 = -0x40;
    do {
      if (ppcVar3 != (char **)ppcVar3[-2]) {
        operator_delete(ppcVar3[-2],(ulong)(*ppcVar3 + 1));
      }
      ppcVar3 = ppcVar3 + -4;
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0);
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result WastParser::ParseRefType(Type* out_type) {
  WABT_TRACE(ParseRefType);
  if (!PeekMatch(TokenType::ValueType)) {
    return ErrorExpected({"funcref", "externref"});
  }

  Token token = Consume();
  Type type = token.type();
  if (type == Type::ExternRef &&
      !options_->features.reference_types_enabled()) {
    Error(token.loc, "value type not allowed: %s", type.GetName().c_str());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}